

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O3

za_file * coda_za_open(char *filename,_func_void_char_ptr_varargs *error_handler)

{
  int iVar1;
  int *piVar2;
  za_file *zf;
  ssize_t sVar3;
  hashtable *phVar4;
  char *pcVar5;
  char *pcVar6;
  code *pcVar7;
  char buffer [2];
  stat statbuf;
  char local_ba;
  char local_b9;
  stat local_b8;
  
  iVar1 = stat(filename,&local_b8);
  if (iVar1 == 0) {
    if ((local_b8.st_mode._1_1_ & 0x80) == 0) {
      pcVar6 = "could not open %s (not a regular file)";
    }
    else {
      if (0x15 < local_b8.st_size) {
        zf = (za_file *)malloc(0x30);
        if (zf == (za_file *)0x0) {
          if (error_handler != (_func_void_char_ptr_varargs *)0x0) {
            pcVar6 = "could not allocate %ld bytes";
            filename = (char *)0x30;
            goto LAB_001681ef;
          }
        }
        else {
          pcVar6 = strdup(filename);
          zf->filename = pcVar6;
          if (pcVar6 == (char *)0x0) {
            free(zf);
            if (error_handler != (_func_void_char_ptr_varargs *)0x0) {
              (*error_handler)("could not duplicate string");
              return (za_file *)0x0;
            }
          }
          else {
            zf->file_size = local_b8.st_size;
            zf->num_entries = 0;
            zf->entry = (za_entry *)0x0;
            zf->hash_data = (hashtable *)0x0;
            pcVar7 = default_error_handler;
            if (error_handler != (_func_void_char_ptr_varargs *)0x0) {
              pcVar7 = error_handler;
            }
            zf->handle_error = pcVar7;
            iVar1 = open(filename,0);
            zf->fd = iVar1;
            if (iVar1 < 0) {
              piVar2 = __errno_location();
              pcVar5 = strerror(*piVar2);
              (*pcVar7)("could not open file \'%s\' (%s)\n",filename,pcVar5);
              free(pcVar6);
              free(zf);
            }
            else {
              sVar3 = read(iVar1,&local_ba,2);
              if (sVar3 < 0) {
                piVar2 = __errno_location();
                pcVar6 = strerror(*piVar2);
                (*pcVar7)(pcVar6);
              }
              else if ((local_ba == 'P') && (local_b9 == 'K')) {
                phVar4 = coda_hashtable_new(1);
                zf->hash_data = phVar4;
                iVar1 = get_entries(zf);
                if (iVar1 == 0) {
                  return zf;
                }
              }
              else {
                (*error_handler)("could not open %s (not a zip file)",filename);
              }
              coda_za_close(zf);
            }
          }
        }
        return (za_file *)0x0;
      }
      pcVar6 = "could not open %s (not a zip file)";
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      pcVar6 = strerror(*piVar2);
      (*error_handler)("could not open %s (%s)",filename,pcVar6);
      return (za_file *)0x0;
    }
    pcVar6 = "could not find %s";
  }
LAB_001681ef:
  (*error_handler)(pcVar6,filename);
  return (za_file *)0x0;
}

Assistant:

za_file *za_open(const char *filename, void (*error_handler)(const char *, ...))
{
    struct stat statbuf;
    za_file *zf;
    char buffer[2];
    int open_flags;

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            error_handler("could not find %s", filename);
        }
        else
        {
            error_handler("could not open %s (%s)", filename, strerror(errno));
        }
        return NULL;
    }
    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        error_handler("could not open %s (not a regular file)", filename);
        return NULL;
    }
    if (statbuf.st_size < 22)
    {
        error_handler("could not open %s (not a zip file)", filename);
        return NULL;
    }

    zf = malloc(sizeof(za_file));
    if (zf == NULL)
    {
        if (error_handler != NULL)
        {
            error_handler("could not allocate %ld bytes", sizeof(za_file));
        }
        return NULL;
    }
    zf->filename = strdup(filename);
    if (zf->filename == NULL)
    {
        free(zf);
        if (error_handler != NULL)
        {
            error_handler("could not duplicate string");
        }
        return NULL;
    }
    zf->file_size = statbuf.st_size;
    zf->num_entries = 0;
    zf->entry = NULL;
    zf->hash_data = NULL;
    if (error_handler != NULL)
    {
        zf->handle_error = error_handler;
    }
    else
    {
        zf->handle_error = default_error_handler;
    }

    open_flags = O_RDONLY;
#ifdef WIN32
    open_flags |= _O_BINARY;
#endif
    zf->fd = open(filename, open_flags);
    if (zf->fd < 0)
    {
        zf->handle_error("could not open file '%s' (%s)\n", filename, strerror(errno));
        free(zf->filename);
        free(zf);
        return NULL;
    }

    if (read(zf->fd, buffer, 2) < 0)
    {
        zf->handle_error(strerror(errno));
        za_close(zf);
        return NULL;
    }
    if (buffer[0] != 'P' || buffer[1] != 'K')
    {
        error_handler("could not open %s (not a zip file)", filename);
        za_close(zf);
        return NULL;
    }

    zf->hash_data = hashtable_new(1);
    if (get_entries(zf) != 0)
    {
        za_close(zf);
        return NULL;
    }

    return zf;
}